

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderWindow.cpp
# Opt level: O3

bool __thiscall sf::RenderWindow::setActive(RenderWindow *this,bool active)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = Window::setActive(&this->super_Window,active);
  if (bVar1) {
    RenderTarget::setActive(&this->super_RenderTarget,active);
    if (active) {
      bVar2 = priv::RenderTextureImplFBO::isAvailable();
      if (bVar2) {
        (*sf_ptrc_glBindFramebufferEXT)(0x8d40,this->m_defaultFrameBuffer);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/src/SFML/Graphics/RenderWindow.cpp"
                           ,0x59,
                           "GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, m_defaultFrameBuffer)");
      }
    }
  }
  return bVar1;
}

Assistant:

bool RenderWindow::setActive(bool active)
{
    bool result = Window::setActive(active);

    // Update RenderTarget tracking
    if (result)
        RenderTarget::setActive(active);

    // If FBOs are available, make sure none are bound when we
    // try to draw to the default framebuffer of the RenderWindow
    if (active && result && priv::RenderTextureImplFBO::isAvailable())
    {
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, m_defaultFrameBuffer));

        return true;
    }

    return result;
}